

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O2

bool __thiscall MipsParser::matchSymbol(MipsParser *this,Parser *parser,char symbol)

{
  bool bVar1;
  int iVar2;
  undefined7 in_register_00000011;
  undefined4 uStack_8;
  
  iVar2 = (int)CONCAT71(in_register_00000011,symbol);
  if (iVar2 == 0x28) {
    uStack_8 = LParen;
  }
  else if (iVar2 == 0x2c) {
    uStack_8 = Comma;
  }
  else {
    if (iVar2 != 0x29) {
      return false;
    }
    uStack_8 = RParen;
  }
  bVar1 = Parser::matchToken(parser,uStack_8,false);
  return bVar1;
}

Assistant:

bool MipsParser::matchSymbol(Parser& parser, char symbol)
{
	switch (symbol)
	{
	case '(':
		return parser.matchToken(TokenType::LParen);
	case ')':
		return parser.matchToken(TokenType::RParen);
	case ',':
		return parser.matchToken(TokenType::Comma);
	}

	return false;
}